

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_thread_test.cc
# Opt level: O0

int main(void)

{
  __type _Var1;
  undefined8 uVar2;
  undefined1 *puVar3;
  int t_2;
  bool found;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int t_1;
  string value;
  int i_2;
  int i_1;
  thread ths [4];
  int i;
  int t;
  RetCode ret;
  string engine_path;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  PolarString *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  undefined1 *puVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  thread *in_stack_fffffffffffffd50;
  Engine *pEVar5;
  int in_stack_fffffffffffffd5c;
  undefined1 *local_288;
  allocator local_249;
  string local_248 [32];
  int local_228;
  byte local_221;
  undefined1 local_220 [16];
  int local_210;
  int local_20c;
  int local_1fc;
  undefined1 local_1f8 [16];
  int local_1e8;
  int local_1e4;
  string local_1e0 [36];
  int local_1bc;
  int local_1ac;
  undefined1 local_1a8 [32];
  undefined1 auStack_188 [8];
  string local_180 [39];
  allocator local_159;
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [36];
  int local_b4;
  int local_b0;
  RetCode local_ac;
  string local_a8 [39];
  allocator local_81;
  string local_80 [32];
  string local_60 [55];
  allocator local_29;
  string local_28 [36];
  int local_4;
  
  local_4 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,"======================= multi thread test ============================",
             &local_29);
  printf_((string *)0x105992);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"./data/test-",&local_81);
  asm_rdtsc();
  std::__cxx11::to_string(CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                 in_stack_fffffffffffffd40);
  std::__cxx11::string::~string(local_a8);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_ac = polar_race::Engine::Open
                       ((string *)in_stack_fffffffffffffd10,
                        (Engine **)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  if (local_ac != kSucc) {
    __assert_fail("ret == kSucc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                  ,0x38,"int main()");
  }
  uVar2 = std::__cxx11::string::c_str();
  printf("open engine_path: %s\n",uVar2);
  for (local_b0 = 0; local_b0 < 4; local_b0 = local_b0 + 1) {
    for (local_b4 = 0; local_b4 < 1000; local_b4 = local_b4 + 1) {
      gen_random((char *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
      std::__cxx11::to_string(in_stack_fffffffffffffd5c);
      std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,k,&local_159);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                     in_stack_fffffffffffffd40);
      std::__cxx11::to_string(in_stack_fffffffffffffd5c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                     in_stack_fffffffffffffd40);
      std::__cxx11::string::operator=
                ((string *)(ks_abi_cxx11_ + (long)local_b4 * 0x20 + (long)local_b0 * 32000),local_d8
                );
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_180);
      std::__cxx11::string::~string(local_f8);
      std::__cxx11::string::~string(local_158);
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string(local_138);
      gen_random((char *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
      std::__cxx11::string::operator=
                ((string *)(vs_abi_cxx11_ + (long)local_b4 * 0x20 + (long)local_b0 * 32000),v);
    }
  }
  local_288 = local_1a8;
  do {
    std::thread::thread((thread *)0x105e8c);
    local_288 = local_288 + 8;
  } while (local_288 != auStack_188);
  for (local_1ac = 0; local_1ac < 4; local_1ac = local_1ac + 1) {
    std::thread::thread<void(&)(int),int&,void>
              (in_stack_fffffffffffffd50,
               (_func_void_int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
               (int *)in_stack_fffffffffffffd40);
    std::thread::operator=
              ((thread *)in_stack_fffffffffffffd10,
               (thread *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::thread::~thread((thread *)0x105f08);
  }
  for (local_1bc = 0; local_1bc < 4; local_1bc = local_1bc + 1) {
    std::thread::join();
  }
  std::__cxx11::string::string(local_1e0);
  for (local_1e4 = 0; local_1e4 < 4; local_1e4 = local_1e4 + 1) {
    for (local_1e8 = 0; pEVar5 = engine, local_1e8 < 1000; local_1e8 = local_1e8 + 1) {
      polar_race::PolarString::PolarString
                (in_stack_fffffffffffffd10,
                 (string *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      local_ac = (*pEVar5->_vptr_Engine[3])(pEVar5,local_1f8,local_1e0);
      if (local_ac != kSucc) {
        __assert_fail("ret == kSucc",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                      ,0x51,"int main()");
      }
      _Var1 = std::operator==(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      if (!_Var1) {
        __assert_fail("value == vs[t][i]",
                      "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                      ,0x52,"int main()");
      }
    }
  }
  for (local_1fc = 0; local_1fc < 4; local_1fc = local_1fc + 1) {
    std::thread::thread<void(&)(int),int&,void>
              (in_stack_fffffffffffffd50,
               (_func_void_int *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
               (int *)in_stack_fffffffffffffd40);
    std::thread::operator=
              ((thread *)in_stack_fffffffffffffd10,
               (thread *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    std::thread::~thread((thread *)0x10615d);
  }
  for (local_20c = 0; local_20c < 4; local_20c = local_20c + 1) {
    std::thread::join();
  }
  local_210 = 0;
  do {
    if (0x31 < local_210) {
      if (engine != (Engine *)0x0) {
        (*engine->_vptr_Engine[1])();
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_248,
                 "======================= multi thread test pass :) ======================",
                 &local_249);
      printf_((string *)0x106366);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator((allocator<char> *)&local_249);
      local_4 = 0;
      std::__cxx11::string::~string(local_1e0);
      puVar4 = local_1a8;
      puVar3 = auStack_188;
      do {
        puVar3 = puVar3 + -8;
        std::thread::~thread((thread *)0x106418);
      } while (puVar3 != puVar4);
      std::__cxx11::string::~string(local_60);
      return local_4;
    }
    pEVar5 = engine;
    polar_race::PolarString::PolarString
              (in_stack_fffffffffffffd10,
               (string *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    local_ac = (*pEVar5->_vptr_Engine[3])(pEVar5,local_220,local_1e0);
    if (local_ac != 0) {
      __assert_fail("ret == kSucc",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                    ,0x5f,"int main()");
    }
    local_221 = 0;
    local_ac = kSucc;
    for (local_228 = 0; local_228 < 4; local_228 = local_228 + 1) {
      _Var1 = std::operator==(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      if (_Var1) {
        local_221 = 1;
        break;
      }
    }
    if ((local_221 & 1) == 0) {
      __assert_fail("found",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/test/multi_thread_test.cc"
                    ,0x68,"int main()");
    }
    local_210 = local_210 + 1;
  } while( true );
}

Assistant:

int main() {

    printf_(
        "======================= multi thread test "
        "============================");
    std::string engine_path =
        std::string("./data/test-") + std::to_string(asm_rdtsc());
    RetCode ret = Engine::Open(engine_path, &engine);
    assert(ret == kSucc);
    printf("open engine_path: %s\n", engine_path.c_str());

    for (int t = 0; t < THREAD_NUM; ++t) {
        for (int i = 0; i < KV_CNT; ++i) {
            gen_random(k, 6);
            ks[t][i] = std::to_string(t) + "th" + std::string(k) + std::to_string(i);

            gen_random(v, 1027);
            vs[t][i] = v;
        }
    }

    std::thread ths[THREAD_NUM];
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i] = std::thread(test_thread, i);
    }
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i].join();
    }

    std::string value;
    for (int t = 0; t < THREAD_NUM; ++t) {
        for (int i = 0; i < KV_CNT; ++i) {
            ret = engine->Read(ks[t][i], &value);
            assert(ret == kSucc);
            assert(value == vs[t][i]);
        }
    }

    ////////////////////////////////////////////////////////////////////
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i] = std::thread(test_thread_conflict, i);
    }
    for (int i = 0; i < THREAD_NUM; ++i) {
        ths[i].join();
    }
    for (int i = 0; i < CONFLICT_KEY; ++i) {
        ret = engine->Read(ks[0][i], &value);
        assert(ret == kSucc);

        bool found = false;
        for (int t = 0; t < THREAD_NUM; ++t) {
            if (value == vs[t][i]) {
                found = true;
                break;
            }
        }
        assert(found);
    }

    delete engine;


    printf_(
        "======================= multi thread test pass :) "
        "======================");

    return 0;
}